

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StaticAnalyser.hpp
# Opt level: O0

Media * __thiscall Analyser::Static::Media::operator+=(Media *this,Media *rhs)

{
  undefined1 local_19;
  Media *pMStack_18;
  anon_class_1_0_00000001 append;
  Media *rhs_local;
  Media *this_local;
  
  pMStack_18 = rhs;
  operator+=(Analyser::Static::Media_const&)::{lambda(auto:1&,auto:2&)#1}::operator()
            (&local_19,&this->disks,&rhs->disks);
  operator+=(Analyser::Static::Media_const&)::{lambda(auto:1&,auto:2&)#1}::operator()
            (&local_19,&this->tapes,&pMStack_18->tapes);
  operator+=(Analyser::Static::Media_const&)::{lambda(auto:1&,auto:2&)#1}::operator()
            (&local_19,&this->cartridges,&pMStack_18->cartridges);
  operator+=(Analyser::Static::Media_const&)::{lambda(auto:1&,auto:2&)#1}::operator()
            (&local_19,&this->mass_storage_devices,&pMStack_18->mass_storage_devices);
  return this;
}

Assistant:

Media &operator +=(const Media &rhs) {
		const auto append = [&](auto &destination, auto &source) {
			destination.insert(destination.end(), source.begin(), source.end());
		};

		append(disks, rhs.disks);
		append(tapes, rhs.tapes);
		append(cartridges, rhs.cartridges);
		append(mass_storage_devices, rhs.mass_storage_devices);

		return *this;
	}